

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

PLTerm mp::internal::ExprBase::Create<mp::PLTerm>(Impl *impl)

{
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> in_RDI;
  PLTerm expr;
  
  PLTerm::PLTerm((PLTerm *)0x147853);
  return (PLTerm)(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }